

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqCommsSS::processRxMessage
          (ZmqCommsSS *this,socket_t *socket,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *connection_info)

{
  int iVar1;
  size_t in_RCX;
  int in_R8D;
  string local_180;
  message_t msg2;
  message_t msg1;
  ActionMessage rep;
  
  zmq::message_t::message_t(&msg1);
  zmq::message_t::message_t(&msg2);
  zmq::detail::socket_base::recv(&socket->super_socket_base,(int)&msg1,(void *)0x0,in_RCX,in_R8D);
  zmq::detail::socket_base::recv(&socket->super_socket_base,(int)&msg2,(void *)0x0,in_RCX,in_R8D);
  iVar1 = processIncomingMessage(this,&msg2,connection_info);
  if (iVar1 == 3) {
    ActionMessage::ActionMessage(&rep,cmd_protocol);
    rep.messageID = 0x130;
    zmq::detail::socket_base::send(&socket->super_socket_base,(int)&msg1,(void *)0x2,in_RCX,in_R8D);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_local_buf[0] = '\0';
    zmq::detail::socket_base::send
              (&socket->super_socket_base,(int)&local_180,(void *)0x2,in_RCX,in_R8D);
    std::__cxx11::string::~string((string *)&local_180);
    ActionMessage::to_string_abi_cxx11_(&local_180,&rep);
    zmq::detail::socket_base::send
              (&socket->super_socket_base,(int)&local_180,(void *)0x1,in_RCX,in_R8D);
    std::__cxx11::string::~string((string *)&local_180);
    ActionMessage::~ActionMessage(&rep);
    iVar1 = 0;
  }
  zmq::message_t::~message_t(&msg2);
  zmq::message_t::~message_t(&msg1);
  return iVar1;
}

Assistant:

int ZmqCommsSS::processRxMessage(zmq::socket_t& socket,
                                 std::map<std::string, std::string>& connection_info)
{
    int status = 0;
    zmq::message_t msg1;
    zmq::message_t msg2;

    socket.recv(msg1);
    socket.recv(msg2);
    status = processIncomingMessage(msg2, connection_info);

    if (status == 3) {
        ActionMessage rep(CMD_PROTOCOL);
        rep.messageID = CONNECTION_ACK;
        socket.send(msg1, zmq::send_flags::sndmore);
        socket.send(std::string{}, zmq::send_flags::sndmore);
        socket.send(rep.to_string(), zmq::send_flags::dontwait);
        status = 0;
    }
    return status;
}